

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

DynamicObject * __thiscall
Js::JavascriptLibrary::CreateConstructorPrototypeObject
          (JavascriptLibrary *this,JavascriptFunction *constructor)

{
  code *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined4 *puVar3;
  DynamicObject *pDVar4;
  DynamicType *type;
  uint uVar5;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  type = (this->constructorPrototypeObjectType).ptr;
  if (type == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a57,"(constructorPrototypeObjectType)",
                                "Where\'s constructorPrototypeObjectType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    type = (this->constructorPrototypeObjectType).ptr;
  }
  pDVar4 = DynamicObject::New(this->recycler,type);
  (*(pDVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(pDVar4,0x67,constructor,6,0,0,(ulong)uVar5 << 0x20);
  return pDVar4;
}

Assistant:

DynamicObject* JavascriptLibrary::CreateConstructorPrototypeObject(JavascriptFunction * constructor)
    {
        AssertMsg(constructorPrototypeObjectType, "Where's constructorPrototypeObjectType?");
        DynamicObject * prototype = DynamicObject::New(this->GetRecycler(), constructorPrototypeObjectType);
        AddMember(prototype, PropertyIds::constructor, constructor);
        return prototype;
    }